

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_reflect_setPrototypeOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue proto_val;
  JSValue obj;
  JSValue JVar1;
  int iVar2;
  BOOL unaff_retaddr;
  JSContext *in_stack_00000008;
  int ret;
  undefined4 in_stack_00000018;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  obj.tag = (int64_t)this_val.u.ptr;
  obj.u.ptr = ctx;
  proto_val.tag._0_4_ = in_stack_00000018;
  proto_val.u.ptr = argv;
  proto_val.tag._4_4_ = argc;
  iVar2 = JS_SetPrototypeInternal(in_stack_00000008,obj,proto_val,unaff_retaddr);
  if (iVar2 < 0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    local_30 = (uint)(iVar2 != 0);
    uStack_2c = uStack_c;
    local_28 = 1;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_reflect_setPrototypeOf(JSContext *ctx, JSValueConst this_val,
                                         int argc, JSValueConst *argv)
{
    int ret;
    ret = JS_SetPrototypeInternal(ctx, argv[0], argv[1], FALSE);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}